

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ecdsa_signature_serialize_compact
              (secp256k1_context *ctx,uchar *output64,secp256k1_ecdsa_signature *sig)

{
  secp256k1_ecdsa_signature *in_RDX;
  uchar *in_RSI;
  secp256k1_context *in_RDI;
  secp256k1_scalar s;
  secp256k1_scalar r;
  char *in_stack_ffffffffffffff98;
  secp256k1_callback *in_stack_ffffffffffffffa0;
  secp256k1_scalar local_40;
  uchar *local_18;
  int local_4;
  
  if (in_RSI == (uchar *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_4 = 0;
  }
  else if (in_RDX == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_4 = 0;
  }
  else {
    local_18 = in_RSI;
    secp256k1_ecdsa_signature_load
              (in_RDI,&local_40,(secp256k1_scalar *)&stack0xffffffffffffffa0,in_RDX);
    secp256k1_scalar_get_b32(local_18,&local_40);
    secp256k1_scalar_get_b32(local_18 + 0x20,(secp256k1_scalar *)&stack0xffffffffffffffa0);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int secp256k1_ecdsa_signature_serialize_compact(const secp256k1_context* ctx, unsigned char *output64, const secp256k1_ecdsa_signature* sig) {
    secp256k1_scalar r, s;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output64 != NULL);
    ARG_CHECK(sig != NULL);

    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    secp256k1_scalar_get_b32(&output64[0], &r);
    secp256k1_scalar_get_b32(&output64[32], &s);
    return 1;
}